

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_widget_is_hovered(nk_context *ctx)

{
  float fVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  uint uVar4;
  nk_rect bounds;
  nk_rect local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  uint uVar5;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4a83,"int nk_widget_is_hovered(struct nk_context *)");
  }
  pnVar2 = ctx->current;
  if (pnVar2 != (nk_window *)0x0) {
    uVar4 = 0;
    uVar5 = 0;
    if (ctx->active == pnVar2) {
      pnVar3 = pnVar2->layout;
      local_48 = ZEXT416((uint)(pnVar3->clip).y);
      local_58 = ZEXT416((uint)(pnVar3->clip).h);
      local_38 = ZEXT416((uint)(float)(int)(pnVar3->clip).x);
      local_28 = ZEXT416((uint)(float)(int)(pnVar3->clip).w);
      nk_layout_peek(&local_68,ctx);
      if ((local_68.x <= (float)local_28._0_4_ + (float)local_38._0_4_) &&
         ((float)local_38._0_4_ <= local_68.x + local_68.w)) {
        uVar4 = uVar5;
        if ((local_68.y <= (float)(int)(float)local_58._0_4_ + (float)(int)(float)local_48._0_4_) &&
           ((float)(int)(float)local_48._0_4_ <= local_68.y + local_68.h)) {
          fVar1 = (ctx->input).mouse.pos.x;
          if (((local_68.x <= fVar1) && (fVar1 < local_68.x + local_68.w)) &&
             (fVar1 = (ctx->input).mouse.pos.y, local_68.y <= fVar1)) {
            uVar4 = (uint)(fVar1 < local_68.y + local_68.h);
          }
        }
      }
    }
    return uVar4;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x4a84,"int nk_widget_is_hovered(struct nk_context *)");
}

Assistant:

NK_API int
nk_widget_is_hovered(struct nk_context *ctx)
{
    struct nk_rect c, v;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current || ctx->active != ctx->current)
        return 0;

    c = ctx->current->layout->clip;
    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_layout_peek(&bounds, ctx);
    nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
        return 0;
    return nk_input_is_mouse_hovering_rect(&ctx->input, bounds);
}